

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O0

void subfrombill(obj *obj,monst *shkp)

{
  obj *local_20;
  obj *otmp;
  monst *shkp_local;
  obj *obj_local;
  
  sub_one_frombill(obj,shkp);
  if (obj->cobj != (obj *)0x0) {
    for (local_20 = obj->cobj; local_20 != (obj *)0x0; local_20 = local_20->nobj) {
      if (local_20->oclass != '\f') {
        if (local_20->cobj == (obj *)0x0) {
          sub_one_frombill(local_20,shkp);
        }
        else {
          subfrombill(local_20,shkp);
        }
      }
    }
  }
  return;
}

Assistant:

void subfrombill(struct obj *obj, struct monst *shkp)
{
	struct obj *otmp;

	sub_one_frombill(obj, shkp);

	if (Has_contents(obj))
	    for (otmp = obj->cobj; otmp; otmp = otmp->nobj) {
		if (otmp->oclass == COIN_CLASS) continue;

		if (Has_contents(otmp))
		    subfrombill(otmp, shkp);
		else
		    sub_one_frombill(otmp, shkp);
	    }
}